

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_negate(secp256k1_context *ctx,secp256k1_pubkey *pubkey)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  secp256k1_ge_storage s;
  secp256k1_ge local_b0;
  secp256k1_ge_storage local_58;
  
  iVar1 = secp256k1_pubkey_load(ctx,&local_b0,pubkey);
  pubkey->data[0] = '\0';
  pubkey->data[1] = '\0';
  pubkey->data[2] = '\0';
  pubkey->data[3] = '\0';
  pubkey->data[4] = '\0';
  pubkey->data[5] = '\0';
  pubkey->data[6] = '\0';
  pubkey->data[7] = '\0';
  pubkey->data[8] = '\0';
  pubkey->data[9] = '\0';
  pubkey->data[10] = '\0';
  pubkey->data[0xb] = '\0';
  pubkey->data[0xc] = '\0';
  pubkey->data[0xd] = '\0';
  pubkey->data[0xe] = '\0';
  pubkey->data[0xf] = '\0';
  pubkey->data[0x10] = '\0';
  pubkey->data[0x11] = '\0';
  pubkey->data[0x12] = '\0';
  pubkey->data[0x13] = '\0';
  pubkey->data[0x14] = '\0';
  pubkey->data[0x15] = '\0';
  pubkey->data[0x16] = '\0';
  pubkey->data[0x17] = '\0';
  pubkey->data[0x18] = '\0';
  pubkey->data[0x19] = '\0';
  pubkey->data[0x1a] = '\0';
  pubkey->data[0x1b] = '\0';
  pubkey->data[0x1c] = '\0';
  pubkey->data[0x1d] = '\0';
  pubkey->data[0x1e] = '\0';
  pubkey->data[0x1f] = '\0';
  pubkey->data[0x20] = '\0';
  pubkey->data[0x21] = '\0';
  pubkey->data[0x22] = '\0';
  pubkey->data[0x23] = '\0';
  pubkey->data[0x24] = '\0';
  pubkey->data[0x25] = '\0';
  pubkey->data[0x26] = '\0';
  pubkey->data[0x27] = '\0';
  pubkey->data[0x28] = '\0';
  pubkey->data[0x29] = '\0';
  pubkey->data[0x2a] = '\0';
  pubkey->data[0x2b] = '\0';
  pubkey->data[0x2c] = '\0';
  pubkey->data[0x2d] = '\0';
  pubkey->data[0x2e] = '\0';
  pubkey->data[0x2f] = '\0';
  pubkey->data[0x30] = '\0';
  pubkey->data[0x31] = '\0';
  pubkey->data[0x32] = '\0';
  pubkey->data[0x33] = '\0';
  pubkey->data[0x34] = '\0';
  pubkey->data[0x35] = '\0';
  pubkey->data[0x36] = '\0';
  pubkey->data[0x37] = '\0';
  pubkey->data[0x38] = '\0';
  pubkey->data[0x39] = '\0';
  pubkey->data[0x3a] = '\0';
  pubkey->data[0x3b] = '\0';
  pubkey->data[0x3c] = '\0';
  pubkey->data[0x3d] = '\0';
  pubkey->data[0x3e] = '\0';
  pubkey->data[0x3f] = '\0';
  if (iVar1 != 0) {
    uVar2 = (local_b0.y.n[4] >> 0x30) * 0x1000003d1 + local_b0.y.n[0];
    uVar3 = (uVar2 >> 0x34) + local_b0.y.n[1];
    uVar4 = (uVar3 >> 0x34) + local_b0.y.n[2];
    uVar5 = (uVar4 >> 0x34) + local_b0.y.n[3];
    local_b0.y.n[0] = 0x3ffffbfffff0bc - (uVar2 & 0xfffffffffffff);
    local_b0.y.n[1] = 0x3ffffffffffffc - (uVar3 & 0xfffffffffffff);
    local_b0.y.n[2] = 0x3ffffffffffffc - (uVar4 & 0xfffffffffffff);
    local_b0.y.n[3] = 0x3ffffffffffffc - (uVar5 & 0xfffffffffffff);
    local_b0.y.n[4] = 0x3fffffffffffc - ((uVar5 >> 0x34) + (local_b0.y.n[4] & 0xffffffffffff));
    secp256k1_ge_to_storage(&local_58,&local_b0);
    *(uint64_t *)(pubkey->data + 0x30) = local_58.y.n[2];
    *(uint64_t *)(pubkey->data + 0x38) = local_58.y.n[3];
    *(uint64_t *)(pubkey->data + 0x20) = local_58.y.n[0];
    *(uint64_t *)(pubkey->data + 0x28) = local_58.y.n[1];
    *(uint64_t *)(pubkey->data + 0x10) = local_58.x.n[2];
    *(uint64_t *)(pubkey->data + 0x18) = local_58.x.n[3];
    *(uint64_t *)pubkey->data = local_58.x.n[0];
    *(uint64_t *)(pubkey->data + 8) = local_58.x.n[1];
  }
  return iVar1;
}

Assistant:

int secp256k1_ec_pubkey_negate(const secp256k1_context* ctx, secp256k1_pubkey *pubkey) {
    int ret = 0;
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);

    ret = secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    if (ret) {
        secp256k1_ge_neg(&p, &p);
        secp256k1_pubkey_save(pubkey, &p);
    }
    return ret;
}